

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O1

xmlChar * xmlEscapePropValue(char *str)

{
  xmlChar xVar1;
  uint uVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  int local_50;
  int local_4c;
  xmlChar *local_48;
  xmlChar *local_40;
  char *local_38;
  
  sVar3 = strlen(str);
  pxVar4 = (xmlChar *)(*_xmlMalloc)(sVar3 * 4 + 1);
  if (pxVar4 != (xmlChar *)0x0) {
    local_48 = pxVar4;
    if (*str != '\0') {
      local_40 = pxVar4 + sVar3 * 4 + 1;
      pcVar8 = str + sVar3;
      local_4c = (int)pxVar4 + 1 + (int)sVar3 * 4;
      local_38 = pcVar8;
      do {
        local_50 = (int)pcVar8 - (int)str;
        uVar2 = xmlGetUTF8Char(str,&local_50);
        iVar6 = (int)pxVar4;
        if (uVar2 == 0xffffffff) {
          xmlStrPrintf(pxVar4,(int)local_40 - iVar6,"\\x%.2x",*str);
          pxVar4 = pxVar4 + 4;
          str = (char *)((xmlChar *)str + 1);
        }
        else if ((((uVar2 < 0x80 && 1 < local_50) || (uVar2 < 0x800 && 2 < local_50)) ||
                 (uVar2 < 0x10000 && 3 < local_50)) || (uVar2 < 0x110000 && 4 < local_50)) {
          if (0 < local_50) {
            iVar6 = local_4c - iVar6;
            lVar7 = 0;
            do {
              xmlStrPrintf(pxVar4,iVar6,"\\x%.2x",((xmlChar *)str)[lVar7]);
              pxVar4 = pxVar4 + 4;
              lVar7 = lVar7 + 1;
              iVar6 = iVar6 + -4;
            } while ((int)lVar7 < local_50);
            str = (char *)((xmlChar *)str + lVar7);
            pcVar8 = local_38;
          }
        }
        else if (((uVar2 < 0xe) && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)) ||
                (uVar5 = uVar2 & 0xfffcfffe,
                ((uVar5 - 0xc0000 < 0xfffe || (uVar5 - 0x80000 < 0xfffe || uVar5 - 0x40000 < 0xfffe)
                 ) || (((uVar2 & 0xfffefffe) - 0x20000 < 0xfffe ||
                       (uVar2 - 0x10000 < 0xfffe || uVar2 - 0xfdf0 < 0x20e)) ||
                      ((uVar2 - 0xe000 < 0x1dd0 || uVar2 == 0x85) ||
                      (uVar2 - 0xa0 < 0xd760 || uVar2 - 0x20 < 0x5f)))) || uVar2 - 0x100000 < 0xfffe
                )) {
          while (bVar9 = local_50 != 0, local_50 = local_50 + -1, bVar9) {
            xVar1 = *str;
            str = (char *)((xmlChar *)str + 1);
            *pxVar4 = xVar1;
            pxVar4 = pxVar4 + 1;
          }
        }
        else {
          xmlStrPrintf(pxVar4,(int)local_40 - iVar6,"&x%x;",uVar2);
        }
      } while (*str != '\0');
    }
    *pxVar4 = '\0';
    return local_48;
  }
  __fprintf_chk(_stderr,1,"memory allocation failure in %s\n","xmlEscapePropValue");
  exit(1);
}

Assistant:

static xmlChar* xmlEscapePropValue(const char *str) {
    size_t len = strlen(str);
    /*
     * The worst-case length of the output is 4 times the input length (if
     * every input byte has to be escaped) plus 1 for the terminating NUL
     * character
     */
    size_t retLen = len * 4 + 1;
    xmlChar* ret = xmlMalloc(retLen), *retPos = ret, *retEnd = ret + retLen;
    if (!ret) {
        fprintf(stderr, "memory allocation failure in %s\n", __func__);
        exit(EXIT_FAILURE);
    }

    const unsigned char *it = (const unsigned char*)str;
    const unsigned char *itEnd = it + len;
    while (*it) {
        int utfLen = itEnd - it;
        int ucs = xmlGetUTF8Char(it, &utfLen);
        if (ucs != -1) {
            if (!isOverlongUTF8(ucs, utfLen)) {
                if (isNonRestrictedXMLChar(ucs)) {
                    /* Valid UTF8 sequence of an allowed character */
                    while (utfLen--)
                        *retPos++ = *it++;
                } else {
                    xmlStrPrintf(retPos, retEnd - retPos, "&x%x;", ucs);
                }
            } else {
                /* Disallowed character or overlong UTF8, escape entire sequence */
                for(int i = 0;i < utfLen;++i) {
                    xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
                    retPos += 4;
                    ++it;
                }
            }
        } else {
            /* Invalid UTF8, escape one byte then try to parse rest of input as UTF8 again */
            xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
            retPos += 4;
            ++it;
        }
    }

    *retPos = '\0';
    return ret;
}